

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>::format
          (source_funcname_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  string_view_t view;
  bool bVar1;
  long in_RSI;
  scoped_padder *in_RDI;
  scoped_padder p;
  size_t text_size;
  scoped_padder p_1;
  memory_buf_t *in_stack_ffffffffffffff68;
  memory_buf_t *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  scoped_padder *in_stack_ffffffffffffff80;
  
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (bVar1) {
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
               (padding_info *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    scoped_padder::~scoped_padder(in_RDI);
  }
  else {
    bVar1 = padding_info::enabled((padding_info *)&in_RDI->dest_);
    if (bVar1) {
      CLI::std::char_traits<char>::length((char_type *)0x5fadae);
    }
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
               (padding_info *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    ::fmt::v11::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)in_stack_ffffffffffffff68,(char *)in_RDI);
    view.size_ = (size_t)in_stack_ffffffffffffff80;
    view.data_ = in_stack_ffffffffffffff78;
    fmt_helper::append_string_view(view,in_stack_ffffffffffffff70);
    scoped_padder::~scoped_padder(in_RDI);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }
        size_t text_size =
            padinfo_.enabled() ? std::char_traits<char>::length(msg.source.funcname) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.funcname, dest);
    }